

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O2

void __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::Update_auxiliary
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_> *this,double *g_i
          )

{
  ChVariables *pCVar1;
  Scalar SVar2;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars1> *local_a0;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars1> *local_98;
  ChVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars1> *local_90;
  void *local_80;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_70 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_58 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_40 [24];
  
  pCVar1 = this->variables_1;
  if (pCVar1->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,6,1,0,6,1>>
              (local_40,&(this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,
               (type *)0x0);
    local_a0 = &this->Cq_1;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_98,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_> *)&local_a0,
               (type *)0x0);
    (*pCVar1->_vptr_ChVariables[4])
              (pCVar1,local_40,
               (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_98);
    Eigen::internal::handmade_aligned_free(local_80);
  }
  pCVar1 = this->variables_2;
  if (pCVar1->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,6,1,0,6,1>>
              (local_58,&(this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,
               (type *)0x0);
    local_a0 = &this->Cq_2;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_98,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_> *)&local_a0,
               (type *)0x0);
    (*pCVar1->_vptr_ChVariables[4])
              (pCVar1,local_58,
               (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_98);
    Eigen::internal::handmade_aligned_free(local_80);
  }
  pCVar1 = this->variables_3;
  if (pCVar1->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,6,1,0,6,1>>
              (local_70,&(this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,
               (type *)0x0);
    local_a0 = &this->Cq_3;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_98,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_> *)&local_a0,
               (type *)0x0);
    (*pCVar1->_vptr_ChVariables[4])
              (pCVar1,local_70,
               (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_98);
    Eigen::internal::handmade_aligned_free(local_80);
  }
  if (this->variables_1->disabled == false) {
    local_98 = &this->Cq_1;
    local_90 = &this->Eq_1;
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_98);
    *g_i = SVar2 + *g_i;
  }
  if (this->variables_2->disabled == false) {
    local_98 = &this->Cq_2;
    local_90 = &this->Eq_2;
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_98);
    *g_i = SVar2 + *g_i;
  }
  if (this->variables_3->disabled == false) {
    local_98 = &this->Cq_3;
    local_90 = &this->Eq_3;
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_98);
    *g_i = SVar2 + *g_i;
  }
  return;
}

Assistant:

void Update_auxiliary(double& g_i) {
        // 1- Assuming jacobians are already computed, now compute
        //   the matrices [Eq_a]=[invM_a]*[Cq_a]' and [Eq_b]
        if (variables_1->IsActive()) {
            variables_1->Compute_invMb_v(Eq_1, Cq_1.transpose());
        }
        if (variables_2->IsActive()) {
            variables_2->Compute_invMb_v(Eq_2, Cq_2.transpose());
        }
        if (variables_3->IsActive()) {
            variables_3->Compute_invMb_v(Eq_3, Cq_3.transpose());
        }

        // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
        if (variables_1->IsActive()) {
            g_i += Cq_1 * Eq_1;
        }
        if (variables_2->IsActive()) {
            g_i += Cq_2 * Eq_2;
        }
        if (variables_3->IsActive()) {
            g_i += Cq_3 * Eq_3;
        }
    }